

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_biquad_reinit(ma_biquad_config *pConfig,ma_biquad *pBQ)

{
  ma_int32 mVar1;
  ma_biquad *pBQ_local;
  ma_biquad_config *pConfig_local;
  
  if ((pBQ == (ma_biquad *)0x0) || (pConfig == (ma_biquad_config *)0x0)) {
    pConfig_local._4_4_ = -2;
  }
  else if ((pConfig->a0 != 0.0) || (NAN(pConfig->a0))) {
    if ((pConfig->format == ma_format_f32) || (pConfig->format == ma_format_s16)) {
      if ((pBQ->format == ma_format_unknown) || (pBQ->format == pConfig->format)) {
        if ((pBQ->channels == 0) || (pBQ->channels == pConfig->channels)) {
          pBQ->format = pConfig->format;
          pBQ->channels = pConfig->channels;
          if (pConfig->format == ma_format_f32) {
            (pBQ->b0).f32 = (float)(pConfig->b0 / pConfig->a0);
            (pBQ->b1).f32 = (float)(pConfig->b1 / pConfig->a0);
            (pBQ->b2).f32 = (float)(pConfig->b2 / pConfig->a0);
            (pBQ->a1).f32 = (float)(pConfig->a1 / pConfig->a0);
            (pBQ->a2).f32 = (float)(pConfig->a2 / pConfig->a0);
          }
          else {
            mVar1 = ma_biquad_float_to_fp(pConfig->b0 / pConfig->a0);
            (pBQ->b0).s32 = mVar1;
            mVar1 = ma_biquad_float_to_fp(pConfig->b1 / pConfig->a0);
            (pBQ->b1).s32 = mVar1;
            mVar1 = ma_biquad_float_to_fp(pConfig->b2 / pConfig->a0);
            (pBQ->b2).s32 = mVar1;
            mVar1 = ma_biquad_float_to_fp(pConfig->a1 / pConfig->a0);
            (pBQ->a1).s32 = mVar1;
            mVar1 = ma_biquad_float_to_fp(pConfig->a2 / pConfig->a0);
            (pBQ->a2).s32 = mVar1;
          }
          pConfig_local._4_4_ = 0;
        }
        else {
          pConfig_local._4_4_ = -3;
        }
      }
      else {
        pConfig_local._4_4_ = -3;
      }
    }
    else {
      pConfig_local._4_4_ = -2;
    }
  }
  else {
    pConfig_local._4_4_ = -2;
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_biquad_reinit(const ma_biquad_config* pConfig, ma_biquad* pBQ)
{
    if (pBQ == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->a0 == 0) {
        return MA_INVALID_ARGS; /* Division by zero. */
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBQ->format != ma_format_unknown && pBQ->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBQ->channels != 0 && pBQ->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }


    pBQ->format   = pConfig->format;
    pBQ->channels = pConfig->channels;

    /* Normalize. */
    if (pConfig->format == ma_format_f32) {
        pBQ->b0.f32 = (float)(pConfig->b0 / pConfig->a0);
        pBQ->b1.f32 = (float)(pConfig->b1 / pConfig->a0);
        pBQ->b2.f32 = (float)(pConfig->b2 / pConfig->a0);
        pBQ->a1.f32 = (float)(pConfig->a1 / pConfig->a0);
        pBQ->a2.f32 = (float)(pConfig->a2 / pConfig->a0);
    } else {
        pBQ->b0.s32 = ma_biquad_float_to_fp(pConfig->b0 / pConfig->a0);
        pBQ->b1.s32 = ma_biquad_float_to_fp(pConfig->b1 / pConfig->a0);
        pBQ->b2.s32 = ma_biquad_float_to_fp(pConfig->b2 / pConfig->a0);
        pBQ->a1.s32 = ma_biquad_float_to_fp(pConfig->a1 / pConfig->a0);
        pBQ->a2.s32 = ma_biquad_float_to_fp(pConfig->a2 / pConfig->a0);
    }

    return MA_SUCCESS;
}